

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O2

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::elementBegin(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               *this,ParserChar *elementName,ParserAttributes *attributes)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  NamespaceStackFrame *pNVar5;
  IUnknownElementHandler *pIVar6;
  StringHashPair SVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  undefined1 uVar12;
  bool bVar13;
  int iVar14;
  iterator iVar15;
  const_iterator cVar16;
  mapped_type *ppIVar18;
  long lVar19;
  iterator iVar20;
  _Elt_pointer pNVar21;
  xmlChar **ppxVar22;
  StringHashPair *pSVar23;
  ElementFunctionMap *this_00;
  long *plVar24;
  mapped_type pIVar25;
  _Base_ptr p_Var26;
  StringHashPair SVar27;
  void *attributeData;
  StringHash namespaceHash;
  void *validationData;
  StringHash currentNsPrefix;
  StringHashPair hashPair;
  _Base_ptr p_Var17;
  
  sVar2 = this->mIgnoreElements;
  sVar3 = this->mUnknownElements;
  sVar4 = this->mNamespaceElements;
  if ((sVar2 != 0 || sVar3 != 0) || sVar4 != 0) {
    pNVar21 = (this->mNamespacesStack).c.
              super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pNVar21 !=
        (this->mNamespacesStack).c.
        super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pNVar21 ==
          (this->mNamespacesStack).c.
          super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar21 = (this->mNamespacesStack).c.
                  super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
      }
      pNVar21[-1].counter = pNVar21[-1].counter + 1;
    }
    if (sVar2 != 0) {
      this->mIgnoreElements = sVar2 + 1;
      return true;
    }
    if (sVar3 != 0) {
      this->mUnknownElements = sVar3 + 1;
      pIVar6 = this->mUnknownHandler;
      if (pIVar6 == (IUnknownElementHandler *)0x0) {
        return true;
      }
      iVar14 = (*pIVar6->_vptr_IUnknownElementHandler[2])(pIVar6,elementName,attributes->attributes)
      ;
      return SUB41(iVar14,0);
    }
    if (sVar4 != 0) {
      this->mNamespaceElements = sVar4 + 1;
      hashPair = Utils::calculateStringHashWithNamespace(elementName);
      pSVar23 = (StringHashPair *)&hashPair.second;
      pIVar25 = this->mActiveNamespaceHandler;
      ppxVar22 = attributes->attributes;
      lVar19 = *(long *)pIVar25;
      goto LAB_006fdfe3;
    }
  }
  iVar14 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[7])(this);
  if ((char)iVar14 != '\0') {
    parseNamespaceDeclarations(this,attributes);
  }
  SVar27 = Utils::calculateStringHashWithNamespace(elementName);
  currentNsPrefix = SVar27.first;
  hashPair.first = SVar27.second;
  namespaceHash = 0;
  pNVar21 = (this->mNamespacesStack).c.
            super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pNVar21 !=
      (this->mNamespacesStack).c.
      super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pNVar21 ==
        (this->mNamespacesStack).c.
        super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pNVar5 = (this->mNamespacesStack).c.
               super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      psVar1 = &pNVar5[8].counter;
      *psVar1 = *psVar1 + 1;
      pNVar21 = pNVar5 + 9;
    }
    else {
      pNVar21[-1].counter = pNVar21[-1].counter + 1;
    }
    iVar15 = std::
             _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)(pNVar21 + -1),&currentNsPrefix);
    SVar7.second = hashPair.first;
    SVar7.first = currentNsPrefix;
    SVar27.second = hashPair.first;
    SVar27.first = currentNsPrefix;
    pNVar21 = (this->mNamespacesStack).c.
              super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pNVar21 ==
        (this->mNamespacesStack).c.
        super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pNVar21 = (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    if ((_Rb_tree_header *)iVar15._M_node !=
        &pNVar21[-1].namespaces._M_t._M_impl.super__Rb_tree_header) {
      namespaceHash = (StringHash)iVar15._M_node[1]._M_parent;
      SVar27 = SVar7;
    }
  }
  hashPair.first = SVar27.second;
  currentNsPrefix = SVar27.first;
  hashPair.second = 0;
  iVar14 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[5])(this);
  if ((char)iVar14 == '\0') {
    bVar13 = false;
  }
  else {
    iVar15 = std::
             _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::find(&(this->mElementToNamespaceMap)._M_t,&hashPair.second);
    if ((_Rb_tree_header *)iVar15._M_node ==
        &(this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = this->mCurrentElementFunctionMap;
      if (this->mCurrentElementFunctionMap == (ElementFunctionMap *)0x0) {
        this_00 = &this->mElementFunctionMap;
      }
      p_Var26 = &(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header;
LAB_006fdede:
      bVar13 = false;
      bVar8 = false;
      if (this->mLaxNamespaceHandling != true) goto LAB_006fdfa9;
    }
    else {
      this_00 = this->mCurrentElementFunctionMap;
      if (this->mCurrentElementFunctionMap == (ElementFunctionMap *)0x0) {
        this_00 = &this->mElementFunctionMap;
      }
      p_Var26 = &(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header;
      bVar8 = true;
      if (iVar15._M_node[1]._M_parent != (_Base_ptr)namespaceHash) goto LAB_006fdede;
    }
    bVar13 = bVar8;
    cVar16 = std::
             _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>,_std::_Select1st<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::find(&this_00->_M_t,&hashPair.second);
    if (cVar16._M_node != p_Var26) {
      attributeData = (void *)0x0;
      validationData = (void *)0x0;
      p_Var17 = cVar16._M_node[2]._M_right;
      if (p_Var17 != (_Base_ptr)0x0) {
        plVar24 = (long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                          *(long *)(cVar16._M_node + 3));
        if (((ulong)p_Var17 & 1) != 0) {
          p_Var17 = *(_Base_ptr *)(*plVar24 + -1 + (long)p_Var17);
        }
        cVar9 = (*(code *)p_Var17)(plVar24,attributes,&attributeData,&validationData);
        if (cVar9 == '\0') {
          if (attributeData != (void *)0x0) {
            p_Var17 = cVar16._M_node[3]._M_right;
            if (((ulong)p_Var17 & 1) != 0) {
              p_Var17 = *(_Base_ptr *)
                         (*(long *)((long)&(this->super_ParserTemplateBase).super_Parser.
                                           _vptr_Parser + *(long *)(cVar16._M_node + 4)) + -1 +
                         (long)p_Var17);
            }
            (*(code *)p_Var17)();
            StackMemoryManager::deleteObject(&(this->super_ParserTemplateBase).mStackMemoryManager);
          }
        }
        else {
          p_Var17 = cVar16._M_node[1]._M_parent;
          plVar24 = (long *)((long)&(cVar16._M_node[1]._M_left)->_M_color + (long)this);
          if (((ulong)p_Var17 & 1) != 0) {
            p_Var17 = *(_Base_ptr *)(*plVar24 + -1 + (long)p_Var17);
          }
          bVar10 = (*(code *)p_Var17)(plVar24,attributeData);
          bVar11 = bVar10;
          if (attributeData != (void *)0x0) {
            p_Var17 = cVar16._M_node[3]._M_right;
            if (((ulong)p_Var17 & 1) != 0) {
              p_Var17 = *(_Base_ptr *)
                         (*(long *)((long)&(this->super_ParserTemplateBase).super_Parser.
                                           _vptr_Parser + *(long *)(cVar16._M_node + 4)) + -1 +
                         (long)p_Var17);
            }
            bVar11 = (*(code *)p_Var17)();
            StackMemoryManager::deleteObject(&(this->super_ParserTemplateBase).mStackMemoryManager);
            bVar11 = bVar10 & bVar11;
          }
          if (bVar11 != 0) {
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
            ::push_back(&(this->super_ParserTemplateBase).mElementDataStack,(value_type *)&hashPair)
            ;
            return (bool)bVar10;
          }
        }
      }
      return false;
    }
  }
LAB_006fdfa9:
  ppIVar18 = std::
             map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
             ::operator[](&this->mNamespaceHandlers,&namespaceHash);
  pIVar25 = *ppIVar18;
  if (pIVar25 == (mapped_type)0x0) {
    iVar14 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[6])(this);
    if (((char)iVar14 == '\0') &&
       (iVar20 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>,_std::_Select1st<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                 ::find(&(this->mElementFunctionMap)._M_t,&hashPair.first),
       bVar13 && (_Rb_tree_header *)iVar20._M_node !=
                 &(this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header)) {
      this->mIgnoreElements = 1;
      return true;
    }
    this->mUnknownElements = 1;
    if (this->mIgnoreElements != 0) {
      return true;
    }
    pIVar6 = this->mUnknownHandler;
    if (pIVar6 == (IUnknownElementHandler *)0x0) {
      bVar13 = ParserTemplateBase::handleError
                         (&this->super_ParserTemplateBase,SEVERITY_ERROR_NONCRITICAL,
                          ERROR_UNKNOWN_ELEMENT,0,elementName);
      return !bVar13;
    }
    iVar14 = (*pIVar6->_vptr_IUnknownElementHandler[2])(pIVar6,elementName,attributes->attributes);
    return (bool)(char)iVar14;
  }
  this->mActiveNamespaceHandler = pIVar25;
  this->mNamespaceElements = 1;
  ppxVar22 = attributes->attributes;
  lVar19 = *(long *)pIVar25;
  pSVar23 = &hashPair;
LAB_006fdfe3:
  uVar12 = (**(code **)(lVar19 + 0x10))(pIVar25,pSVar23,elementName,ppxVar22);
  return (bool)uVar12;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementBegin( const ParserChar* elementName,
																   const ParserAttributes& attributes)
	{
        if ( (mIgnoreElements > 0 || mUnknownElements > 0 || mNamespaceElements > 0) 
            && !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements++;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements++;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementBegin( elementName, attributes.attributes );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements++;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementBegin( hashPair.second, elementName, attributes.attributes );
        }

        if ( isDifferentNamespaceAllowed() )
        {
            parseNamespaceDeclarations( attributes );
        }
        ElementData newElementData;
        StringHashPair elementNsPair = Utils::calculateStringHashWithNamespace(elementName);
        newElementData.elementHash = elementNsPair.second;
        StringHash currentNsPrefix = elementNsPair.first;
        StringHash namespaceHash = 0;
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
            typename NamespacePrefixesMap::iterator nsIter = mNamespacesStack.top().namespaces.find( currentNsPrefix );
            if ( nsIter != mNamespacesStack.top().namespaces.end() )
            {
                namespaceHash = nsIter->second;
            }
        }
        newElementData.generatedElementHash = 0;
        newElementData.typeID = 0;
        newElementData.validationData = 0;
        bool foundElementHash = findElementHash( newElementData );

        bool correctNamespace = false;
        if ( foundElementHash )
        {
            typename NamespacePrefixesMap::const_iterator nsFromMap = mElementToNamespaceMap.find( newElementData.generatedElementHash );
            if ( nsFromMap != mElementToNamespaceMap.end() && nsFromMap->second == namespaceHash )
            {
                correctNamespace = true;
            }
        }

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->end();
        if ( foundElementHash && (correctNamespace || mLaxNamespaceHandling) )
            it = functionMapToUse->find(newElementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
		{
            INamespaceHandler* nsHandler = mNamespaceHandlers[ namespaceHash ];
            if ( nsHandler != 0 )
            {
                mActiveNamespaceHandler = nsHandler;
                mNamespaceElements = 1;
                return nsHandler->elementBegin( newElementData.elementHash, elementName, attributes.attributes );
            }
            if ( isXsAnyAllowed( newElementData.elementHash ) )
            {
                mUnknownElements = 1;
            }
            else
            {
                it = mElementFunctionMap.find(newElementData.elementHash);
                if ( it != mElementFunctionMap.end() && correctNamespace )
                {
                    mIgnoreElements = 1;
                }
                else
                {
                    mUnknownElements = 1;
                }
            }
            if ( mIgnoreElements )
            {
                return true;
            }
            if ( mUnknownElements )
            {
                if ( mUnknownHandler != 0 )
                {
                    return mUnknownHandler->elementBegin( elementName, attributes.attributes );
                }
                else
                {
			        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
							         ParserError::ERROR_UNKNOWN_ELEMENT,
				                     0,
				                     elementName))
			        {
				        return false;
			        }
			        else
			        {
				        return true;
			        }
                }
            }
		}
		const FunctionStruct& functions = it->second;

		void* attributeData = 0;
		void* validationData = 0;
		if ( !functions.validateBeginFunction || !(static_cast<DerivedClass*>(this)->*functions.validateBeginFunction)(attributes, &attributeData, &validationData) )
        {
            // avoid leak
            if ( attributeData )
            {
                (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
                mStackMemoryManager.deleteObject(); // attribute data
            }
			return false;
        }

		bool success = (static_cast<DerivedClass*>(this)->*functions.beginFunction)(attributeData);
		if ( attributeData )
        {
            bool attrFreeSuccess = (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
			mStackMemoryManager.deleteObject(); // attribute data
            if ( !attrFreeSuccess )
            {
                return false;
            }
        }

		if ( success )
		{
            mElementDataStack.push_back(newElementData);
			newElementData.validationData = validationData;
		}
		return success;
	}